

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockd.h
# Opt level: O2

TX_SIZE tx_size_from_tx_mode(BLOCK_SIZE bsize,TX_MODE tx_mode)

{
  byte bVar1;
  undefined3 in_register_00000031;
  undefined3 in_register_00000039;
  uint uVar2;
  
  uVar2 = CONCAT31(in_register_00000039,bsize);
  bVar1 = ""[CONCAT31(in_register_00000031,tx_mode)];
  if (uVar2 != 0) {
    if (""[""[uVar2]] <= bVar1) {
      bVar1 = ""[uVar2];
    }
    return bVar1;
  }
  if (""[uVar2] < bVar1) {
    bVar1 = ""[uVar2];
  }
  return bVar1;
}

Assistant:

static inline TX_SIZE tx_size_from_tx_mode(BLOCK_SIZE bsize, TX_MODE tx_mode) {
  const TX_SIZE largest_tx_size = tx_mode_to_biggest_tx_size[tx_mode];
  const TX_SIZE max_rect_tx_size = max_txsize_rect_lookup[bsize];
  if (bsize == BLOCK_4X4)
    return AOMMIN(max_txsize_lookup[bsize], largest_tx_size);
  if (txsize_sqr_map[max_rect_tx_size] <= largest_tx_size)
    return max_rect_tx_size;
  else
    return largest_tx_size;
}